

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O3

void __thiscall
Assimp::SIBImporter::InternReadFile
          (SIBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *ppaVar1;
  aiVector3D **__s;
  float fVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  uint32_t posB;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  iterator iVar8;
  pointer paVar9;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  pointer pSVar16;
  pointer puVar17;
  _Alloc_hider _Var18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  uint i_1;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined4 extraout_var;
  aiMaterial *this_00;
  SIBChunk SVar24;
  aiMesh *paVar25;
  aiLight *paVar26;
  SIBEdge *pSVar27;
  undefined8 uVar28;
  aiMatrix4x4t<float> *paVar29;
  Logger *this_01;
  ulong *puVar30;
  aiFace *paVar31;
  aiVector3D *paVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var33;
  aiMesh **__dest;
  aiLight **ppaVar34;
  aiNode *this_02;
  aiNode **ppaVar35;
  aiNode *paVar36;
  uint *puVar37;
  aiMetadata *paVar38;
  aiString *paVar39;
  aiMetadataEntry *paVar40;
  undefined1 *puVar41;
  aiNode *paVar42;
  runtime_error *prVar43;
  aiLightSourceType aVar44;
  aiFace *paVar45;
  pointer pTVar46;
  ulong uVar47;
  uint uVar48;
  uint32_t uVar49;
  pointer pSVar50;
  uint uVar51;
  size_type __n;
  ulong uVar53;
  long lVar54;
  uint32_t *puVar55;
  ulong uVar56;
  iterator iVar57;
  uint32_t uVar58;
  size_t __n_00;
  pointer puVar59;
  char *pcVar60;
  ulong uVar61;
  int8_t *piVar62;
  long lVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  StreamReaderLE stream;
  float shiny;
  SIB sib;
  aiMaterial *defmtl;
  aiColor3D emis;
  aiVector3D uv;
  aiColor3D ambi;
  aiColor3D spec;
  aiColor3D diff;
  aiString name;
  aiString tex;
  aiString defname;
  ulong local_1058;
  StreamReader<false,_false> local_1040;
  aiVector3t<float> local_1008;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  aiVector3t<float> local_fe8;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  aiScene *local_fc0;
  undefined8 local_fb8;
  undefined8 local_fa8;
  undefined8 local_f98;
  void *local_f88;
  iterator iStack_f80;
  aiMaterial **local_f78;
  void *pvStack_f70;
  iterator local_f68;
  aiMesh **ppaStack_f60;
  aiLight **local_f58;
  iterator iStack_f50;
  aiLight **local_f48;
  vector<SIBObject,_std::allocator<SIBObject>_> vStack_f40;
  vector<SIBObject,_std::allocator<SIBObject>_> local_f28;
  aiMaterial *local_f10;
  undefined1 local_f08 [32];
  undefined8 local_ee8;
  aiVector3t<float> local_ed8;
  undefined1 local_ec8 [12];
  float fStack_ebc;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  aiMatrix4x4 *local_e80;
  undefined1 local_e78 [12];
  float fStack_e6c;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  undefined8 local_e38;
  undefined8 local_e28;
  undefined8 local_e18;
  undefined1 local_e08 [24];
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float local_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float local_dcc;
  uint local_dc8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_dc0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_da8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d48;
  pointer local_d30;
  pointer local_d28;
  _Rb_tree_node_base local_d10;
  size_t local_cf0;
  undefined8 local_ce8;
  undefined8 local_cd8;
  float local_cc8;
  float local_cb8;
  float local_ca8;
  undefined1 local_c90 [5];
  undefined1 auStack_c8b [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c88;
  aiVector3t<float> local_c80 [84];
  aiMatrix4x4 local_88c;
  ulong local_848;
  size_t local_840;
  undefined1 local_838 [1028];
  aiString local_434;
  SIBChunk *pSVar52;
  
  _local_c90 = (pointer)local_c80;
  local_fc0 = pScene;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"rb","");
  iVar20 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,_local_c90);
  StreamReader<false,_false>::StreamReader
            (&local_1040,(IOStream *)CONCAT44(extraout_var,iVar20),false);
  if ((aiVector3t<float> *)_local_c90 != local_c80) {
    operator_delete(_local_c90);
  }
  if (((int)local_1040.end - (int)local_1040.current & 0xfffffff0U) == 0) {
    prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c90,
                   "SIB file is either empty or corrupt: ",pFile);
    std::runtime_error::runtime_error(prVar43,(string *)local_c90);
    *(undefined ***)prVar43 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar43,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f48 = (aiLight **)0x0;
  vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f58 = (aiLight **)0x0;
  iStack_f50._M_current = (aiLight **)0x0;
  local_f68._M_current = (aiMesh **)0x0;
  ppaStack_f60 = (aiMesh **)0x0;
  local_f78 = (aiMaterial **)0x0;
  pvStack_f70 = (void *)0x0;
  local_f88 = (void *)0x0;
  iStack_f80._M_current = (aiMaterial **)0x0;
  local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_f10 = this_00;
  _local_c90 = (pointer)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"DefaultMaterial","");
  _Var18._M_p = _local_c90;
  __n_00 = 0x3ff;
  if (((ulong)local_c88._M_pi & 0xfffffc00) == 0) {
    __n_00 = (ulong)local_c88._M_pi & 0xffffffff;
  }
  local_434.length = (ai_uint32)__n_00;
  memcpy(local_434.data,_local_c90,__n_00);
  local_434.data[__n_00] = '\0';
  if ((aiVector3t<float> *)_Var18._M_p != local_c80) {
    operator_delete(_Var18._M_p);
  }
  aiMaterial::AddProperty(local_f10,&local_434,"?mat.name",0,0);
  if (iStack_f80._M_current == local_f78) {
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_f88,iStack_f80,&local_f10);
  }
  else {
    *iStack_f80._M_current = local_f10;
    iStack_f80._M_current = iStack_f80._M_current + 1;
  }
  if (((int)local_1040.limit - (int)local_1040.current & 0xfffffff8U) != 0) {
    local_e80 = &local_88c;
    do {
      SVar24 = ReadChunk(&local_1040);
      uVar51 = ((int)local_1040.current - (int)local_1040.buffer) + SVar24.Size;
      pSVar52 = (SIBChunk *)(ulong)uVar51;
      local_f08._28_4_ = StreamReader<false,_false>::SetReadLimit(&local_1040,uVar51);
      uVar58 = SVar24.Tag;
      if ((int)uVar58 < 0x4c474854) {
        if (uVar58 != 0x47525053) {
          if (uVar58 == 0x48454144) {
            uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
            if (uVar51 - 3 < 0xfffffffe) {
              prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
              _local_c90 = (pointer)local_c80;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c90,"SIB: Unsupported file version.","");
              std::runtime_error::runtime_error(prVar43,(string *)local_c90);
              *(undefined ***)prVar43 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar43,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            if (uVar58 != 0x494e5354) goto LAB_005effd4;
            _local_c90 = _local_c90 & 0xffffff0000000000;
            memset(local_c90 + 5,0x1b,0x3ff);
            local_88c.a1 = 1.0;
            local_88c.a2 = 0.0;
            local_88c.a3 = 0.0;
            local_88c.a4 = 0.0;
            local_88c.b1 = 0.0;
            local_88c.b2 = 1.0;
            local_88c.b3 = 0.0;
            local_88c.b4 = 0.0;
            local_88c.c1 = 0.0;
            local_88c.c2 = 0.0;
            local_88c.c3 = 1.0;
            local_88c.c4 = 0.0;
            local_88c.d1 = 0.0;
            local_88c.d2 = 0.0;
            local_88c.d3 = 0.0;
            local_88c.d4 = 1.0;
            if (((int)local_1040.limit - (int)local_1040.current & 0xfffffff8U) == 0) {
              uVar47 = 0;
            }
            else {
              uVar47 = 0;
              do {
                SVar24 = ReadChunk(&local_1040);
                uVar51 = ((int)local_1040.current - (int)local_1040.buffer) + SVar24.Size;
                pSVar52 = (SIBChunk *)(ulong)uVar51;
                uVar51 = StreamReader<false,_false>::SetReadLimit(&local_1040,uVar51);
                uVar58 = SVar24.Tag;
                if ((int)uVar58 < 0x50494e46) {
                  if (uVar58 == 0x41584953) {
                    ReadAxis(local_e80,&local_1040);
                  }
                  else if (uVar58 != 0x44494e46) {
                    if (uVar58 == 0x494e5349) {
                      uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                      uVar47 = (ulong)uVar21;
                    }
                    else {
LAB_005efc8c:
                      UnknownChunk((StreamReaderLE *)((ulong)SVar24 & 0xffffffff),pSVar52);
                    }
                  }
                }
                else if (uVar58 != 0x50494e46) {
                  if (uVar58 == 0x534d5458) {
                    fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_ff8 = (aiMaterial **)CONCAT44(extraout_XMM0_Db,fVar65);
                    uStack_ff0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_fd8 = (aiVector3D **)CONCAT44(extraout_XMM0_Db_00,fVar65);
                    uStack_fd0 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_fb8 = (char *)CONCAT44(extraout_XMM0_Db_01,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_f98 = (void *)CONCAT44(extraout_XMM0_Db_02,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_ee8 = (int8_t *)CONCAT44(extraout_XMM0_Db_03,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_e18 = CONCAT44(extraout_XMM0_Db_04,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_cd8 = (int8_t *)CONCAT44(extraout_XMM0_Db_05,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_ce8 = (pointer)CONCAT44(extraout_XMM0_Db_06,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_e28 = CONCAT44(extraout_XMM0_Db_07,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_e38 = CONCAT44(extraout_XMM0_Db_08,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_fa8 = CONCAT44(extraout_XMM0_Db_09,fVar65);
                    local_ca8 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_cb8 = StreamReader<false,_false>::Get<float>(&local_1040);
                    local_cc8 = StreamReader<false,_false>::Get<float>(&local_1040);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                    fVar69 = local_88c.a2 * local_cb8;
                    fVar4 = local_88c.a1 * (float)local_f98;
                    fVar67 = local_88c.a1 * (float)local_ce8;
                    fVar68 = local_88c.a1 * local_ca8;
                    fVar66 = local_88c.a3 * (float)local_e18;
                    fVar2 = local_88c.a3 * local_cc8;
                    local_88c.a1 = local_88c.a4 * (float)local_fb8 +
                                   local_88c.a3 * (float)local_fd8 +
                                   local_88c.a1 * fVar64 + local_88c.a2 * (float)local_ff8;
                    local_88c.a3 = local_88c.a4 * (float)local_fa8 +
                                   local_88c.a3 * (float)local_e38 +
                                   fVar67 + local_88c.a2 * (float)local_e28;
                    local_88c.a2 = local_88c.a4 * (float)local_cd8 +
                                   fVar66 + fVar4 + local_88c.a2 * (float)local_ee8;
                    fVar70 = local_88c.b2 * (float)local_ff8;
                    fVar71 = local_88c.b2 * (float)local_e28;
                    fVar72 = local_88c.b2 * local_cb8;
                    fVar66 = local_88c.b1 * (float)local_ce8;
                    fVar4 = local_88c.b1 * local_ca8;
                    fVar67 = local_88c.b4 * (float)local_fa8;
                    local_88c.b2 = local_88c.b4 * (float)local_cd8 +
                                   local_88c.b3 * (float)local_e18 +
                                   local_88c.b1 * (float)local_f98 + local_88c.b2 * (float)local_ee8
                    ;
                    local_88c.b1 = local_88c.b4 * (float)local_fb8 +
                                   local_88c.b3 * (float)local_fd8 + local_88c.b1 * fVar64 + fVar70;
                    local_88c.a4 = local_88c.a4 * fVar65 + fVar2 + fVar68 + fVar69;
                    local_88c.b4 = local_88c.b4 * fVar65 + local_88c.b3 * local_cc8 + fVar4 + fVar72
                    ;
                    local_88c.b3 = fVar67 + local_88c.b3 * (float)local_e38 + fVar66 + fVar71;
                    fVar4 = local_88c.c2 * (float)local_ff8;
                    fVar72 = local_88c.c2 * local_cb8;
                    fVar68 = local_88c.c1 * local_ca8;
                    fVar66 = local_88c.c3 * (float)local_fd8;
                    fVar2 = local_88c.c3 * (float)local_e18;
                    fVar71 = local_88c.c3 * local_cc8;
                    local_88c.c3 = local_88c.c4 * (float)local_fa8 +
                                   local_88c.c3 * (float)local_e38 +
                                   local_88c.c1 * (float)local_ce8 + local_88c.c2 * (float)local_e28
                    ;
                    local_88c.c2 = local_88c.c4 * (float)local_cd8 +
                                   fVar2 + local_88c.c1 * (float)local_f98 +
                                           local_88c.c2 * (float)local_ee8;
                    local_88c.c1 = local_88c.c4 * (float)local_fb8 +
                                   fVar66 + local_88c.c1 * fVar64 + fVar4;
                    local_1058._0_4_ = local_88c.d2;
                    fVar69 = local_88c.d1 * (float)local_f98;
                    fVar70 = local_88c.d1 * (float)local_ce8;
                    fVar66 = local_88c.d3 * (float)local_e18;
                    fVar2 = local_88c.d4 * (float)local_fb8;
                    fVar4 = local_88c.d4 * (float)local_cd8;
                    fVar67 = local_88c.d4 * (float)local_fa8;
                    local_88c.d4 = local_88c.d4 * fVar65 +
                                   local_88c.d3 * local_cc8 +
                                   local_88c.d1 * local_ca8 + (float)local_1058 * local_cb8;
                    local_88c.d1 = fVar2 + local_88c.d3 * (float)local_fd8 +
                                           local_88c.d1 * fVar64 +
                                           (float)local_1058 * (float)local_ff8;
                    local_88c.c4 = local_88c.c4 * fVar65 + fVar71 + fVar68 + fVar72;
                    local_88c.d3 = fVar67 + local_88c.d3 * (float)local_e38 +
                                            fVar70 + (float)local_1058 * (float)local_e28;
                    local_88c.d2 = fVar4 + fVar66 + fVar69 + (float)local_1058 * (float)local_ee8;
                  }
                  else {
                    if (uVar58 != 0x534e414d) goto LAB_005efc8c;
                    ReadString((aiString *)local_838,&local_1040,SVar24.Size >> 1);
                    uVar56 = local_838._0_8_ & 0xffffffff;
                    local_c90._0_4_ = local_838._0_4_;
                    memcpy(local_c90 + 4,local_838 + 4,uVar56);
                    local_c90[uVar56 + 4] = 0;
                  }
                }
                StreamReader<false,_false>::SetPtr
                          (&local_1040,
                           (int8_t *)
                           ((ulong)(uint)((int)local_1040.limit - (int)local_1040.buffer) +
                           CONCAT44(local_1040.buffer._4_4_,(int)local_1040.buffer)));
                StreamReader<false,_false>::SetReadLimit(&local_1040,uVar51);
              } while (((int)local_1040.limit - (int)local_1040.current & 0xfffffff8U) != 0);
            }
            uVar56 = ((long)vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
            if (uVar56 < uVar47 || uVar56 - uVar47 == 0) {
              prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_838._0_8_ = local_838 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_838,"SIB: Invalid shape index.","");
              std::runtime_error::runtime_error(prVar43,(string *)local_838);
              *(undefined ***)prVar43 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar43,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            local_848 = vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar47].meshIdx;
            local_840 = vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar47].meshCount;
            std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                      (&local_f28,(value_type *)local_c90);
          }
        }
      }
      else if ((int)uVar58 < 0x53484150) {
        if (uVar58 == 0x4c474854) {
          paVar26 = (aiLight *)operator_new(0x46c);
          (paVar26->mName).length = 0;
          (paVar26->mName).data[0] = '\0';
          memset((paVar26->mName).data + 1,0x1b,0x3ff);
          paVar26->mType = aiLightSource_UNDEFINED;
          (paVar26->mPosition).x = 0.0;
          (paVar26->mPosition).y = 0.0;
          (paVar26->mPosition).z = 0.0;
          (paVar26->mDirection).x = 0.0;
          (paVar26->mDirection).y = 0.0;
          *(undefined8 *)&(paVar26->mDirection).z = 0;
          (paVar26->mUp).x = 0.0;
          (paVar26->mUp).y = 0.0;
          *(undefined8 *)&(paVar26->mUp).z = 0;
          paVar26->mAttenuationLinear = 1.0;
          paVar26->mAttenuationQuadratic = 0.0;
          (paVar26->mColorDiffuse).r = 0.0;
          (paVar26->mColorDiffuse).g = 0.0;
          (paVar26->mColorDiffuse).b = 0.0;
          (paVar26->mColorSpecular).r = 0.0;
          (paVar26->mColorSpecular).g = 0.0;
          *(undefined8 *)&(paVar26->mColorSpecular).b = 0;
          (paVar26->mColorAmbient).g = 0.0;
          (paVar26->mColorAmbient).b = 0.0;
          paVar26->mAngleInnerCone = 6.2831855;
          paVar26->mAngleOuterCone = 6.2831855;
          (paVar26->mSize).x = 0.0;
          (paVar26->mSize).y = 0.0;
          local_838._0_8_ = paVar26;
          if (((int)local_1040.limit - (int)local_1040.current & 0xfffffff8U) != 0) {
            local_fb8 = (paVar26->mName).data;
            do {
              SVar24 = ReadChunk(&local_1040);
              uVar51 = ((int)local_1040.current - (int)local_1040.buffer) + SVar24.Size;
              pSVar52 = (SIBChunk *)(ulong)uVar51;
              uVar51 = StreamReader<false,_false>::SetReadLimit(&local_1040,uVar51);
              if (SVar24.Tag == 0x534e414d) {
                ReadString((aiString *)local_c90,&local_1040,SVar24.Size >> 1);
                uVar47 = (ulong)_local_c90 & 0xffffffff;
                (paVar26->mName).length = local_c90._0_4_;
                memcpy(local_fb8,local_c90 + 4,uVar47);
                (paVar26->mName).data[uVar47] = '\0';
              }
              else if (SVar24.Tag == 0x4c4e464f) {
                uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                aVar44 = aiLightSource_UNDEFINED;
                if (uVar21 < 3) {
                  aVar44 = *(aiLightSourceType *)(&DAT_0078cdf8 + (ulong)uVar21 * 4);
                }
                paVar26->mType = aVar44;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                (paVar26->mPosition).x = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                (paVar26->mPosition).y = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                (paVar26->mPosition).z = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                (paVar26->mDirection).x = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                (paVar26->mDirection).y = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                (paVar26->mDirection).z = fVar64;
                ReadColor((StreamReaderLE *)local_c90);
                *(pointer *)&paVar26->mColorDiffuse = _local_c90;
                (paVar26->mColorDiffuse).b = local_c88._M_pi._0_4_;
                ReadColor((StreamReaderLE *)local_c90);
                *(pointer *)&paVar26->mColorAmbient = _local_c90;
                (paVar26->mColorAmbient).b = local_c88._M_pi._0_4_;
                ReadColor((StreamReaderLE *)local_c90);
                *(pointer *)&paVar26->mColorSpecular = _local_c90;
                (paVar26->mColorSpecular).b = local_c88._M_pi._0_4_;
                fVar65 = StreamReader<false,_false>::Get<float>(&local_1040);
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                local_ff8 = (aiMaterial **)CONCAT44(local_ff8._4_4_,fVar64);
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                paVar26->mAttenuationConstant = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                paVar26->mAttenuationLinear = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                paVar26->mAttenuationQuadratic = fVar64;
                fVar64 = 1e-05;
                if (1e-05 <= fVar65) {
                  fVar64 = fVar65;
                }
                local_fd8 = (aiVector3D **)CONCAT44(local_fd8._4_4_,1.0 / fVar64);
                fVar64 = powf(0.99,1.0 / fVar64);
                fVar65 = acosf(fVar64);
                fVar64 = powf(0.01,(float)local_fd8);
                fVar66 = acosf(fVar64);
                fVar64 = (float)local_ff8 * 0.017453292;
                if (fVar66 <= (float)local_ff8 * 0.017453292) {
                  fVar64 = fVar66;
                }
                fVar66 = fVar64;
                if (fVar65 <= fVar64) {
                  fVar66 = fVar65;
                }
                paVar26->mAngleInnerCone = fVar66;
                paVar26->mAngleOuterCone = fVar64;
              }
              else {
                UnknownChunk((StreamReaderLE *)((ulong)SVar24 & 0xffffffff),pSVar52);
              }
              StreamReader<false,_false>::SetPtr
                        (&local_1040,
                         (int8_t *)
                         ((ulong)(uint)((int)local_1040.limit - (int)local_1040.buffer) +
                         CONCAT44(local_1040.buffer._4_4_,(int)local_1040.buffer)));
              StreamReader<false,_false>::SetReadLimit(&local_1040,uVar51);
            } while (((int)local_1040.limit - (int)local_1040.current & 0xfffffff8U) != 0);
          }
          if (iStack_f50._M_current == local_f48) {
            std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                      ((vector<aiLight*,std::allocator<aiLight*>> *)&local_f58,iStack_f50,
                       (aiLight **)local_838);
          }
          else {
            *iStack_f50._M_current = paVar26;
            iStack_f50._M_current = iStack_f50._M_current + 1;
          }
        }
        else if (uVar58 == 0x4d415452) {
          ReadColor((StreamReaderLE *)local_e08);
          ReadColor((StreamReaderLE *)local_ec8);
          ReadColor((StreamReaderLE *)local_e78);
          ReadColor((StreamReaderLE *)local_f08);
          uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
          local_fe8.x = (float)uVar51;
          uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
          ReadString((aiString *)local_c90,&local_1040,uVar51 >> 1);
          uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
          ReadString((aiString *)local_838,&local_1040,uVar51 >> 1);
          paVar25 = (aiMesh *)operator_new(0x10);
          aiMaterial::aiMaterial((aiMaterial *)paVar25);
          local_1008._0_8_ = paVar25;
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar25,local_e08,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar25,local_ec8,0xc,"$clr.ambient",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar25,local_e78,0xc,"$clr.specular",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar25,local_f08,0xc,"$clr.emissive",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar25,&local_fe8,4,"$mat.shininess",0,0,aiPTI_Float);
          aiMaterial::AddProperty((aiMaterial *)paVar25,(aiString *)local_c90,"?mat.name",0,0);
          if (local_838._0_4_ != 0) {
            aiMaterial::AddProperty((aiMaterial *)paVar25,(aiString *)local_838,"$tex.file",1,0);
            aiMaterial::AddProperty((aiMaterial *)paVar25,(aiString *)local_838,"$tex.file",3,0);
          }
          if (iStack_f80._M_current == local_f78) {
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
            _M_realloc_insert<aiMaterial*const&>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_f88,iStack_f80,
                       (aiMaterial **)&local_1008);
          }
          else {
            *iStack_f80._M_current = (aiMaterial *)paVar25;
            iStack_f80._M_current = iStack_f80._M_current + 1;
          }
        }
        else {
LAB_005effd4:
          UnknownChunk((StreamReaderLE *)((ulong)SVar24 & 0xffffffff),pSVar52);
        }
      }
      else if (uVar58 == 0x53484150) {
        local_e08._0_4_ = 1.0;
        local_e08._4_4_ = 0.0;
        local_e08._8_4_ = 0.0;
        local_e08._12_4_ = 0.0;
        local_e08._16_4_ = 0.0;
        local_e08._20_4_ = 1.0;
        uStack_df0 = (int8_t *)0x0;
        uStack_de8 = (int8_t *)0x0;
        local_de0 = 1.0;
        local_ddc = 0.0;
        fStack_dd8 = 0.0;
        fStack_dd4 = 0.0;
        fStack_dd0 = 0.0;
        local_dcc = 1.0;
        local_d10._M_color = _S_red;
        local_d10._M_parent = (_Base_ptr)0x0;
        memset(&local_dc0,0,0xa8);
        local_d10._M_left = &local_d10;
        local_cf0 = 0;
        local_fa8 = 0;
        local_838._0_8_ = local_838._0_8_ & 0xffffff0000000000;
        local_d10._M_right = local_d10._M_left;
        memset(local_838 + 5,0x1b,0x3ff);
        while (((int)local_1040.limit - (int)local_1040.current & 0xfffffff8U) != 0) {
          SVar24 = ReadChunk(&local_1040);
          uVar21 = SVar24.Size;
          uVar51 = ((int)local_1040.current - (int)local_1040.buffer) + uVar21;
          pSVar52 = (SIBChunk *)(ulong)uVar51;
          uVar51 = StreamReader<false,_false>::SetReadLimit(&local_1040,uVar51);
          uVar58 = SVar24.Tag;
          if ((int)uVar58 < 0x46545653) {
            if ((int)uVar58 < 0x46414353) {
              if ((int)uVar58 < 0x45435253) {
                if (uVar58 == 0x41584953) {
                  ReadAxis((aiMatrix4x4 *)local_e08,&local_1040);
                }
                else if (uVar58 != 0x44494e46) goto LAB_005f0a06;
              }
              else if (uVar58 == 0x45435253) {
                while ((int)local_1040.limit != (int)local_1040.current) {
                  uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                  uVar47 = (ulong)uVar21;
                  uVar56 = ((long)local_d28 - (long)local_d30 >> 2) * -0x5555555555555555;
                  if (uVar56 < uVar47 || uVar56 - uVar47 == 0) {
                    prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                    _local_c90 = (pointer)local_c80;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_c90,"SIB: Invalid edge index.","");
                    std::runtime_error::runtime_error(prVar43,(string *)local_c90);
                    *(undefined ***)prVar43 = &PTR__runtime_error_008dc448;
                    __cxa_throw(prVar43,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_d30[uVar47].creased = true;
                }
              }
              else {
                if (uVar58 != 0x45444753) goto LAB_005f0a06;
                while ((int)local_1040.limit != (int)local_1040.current) {
                  uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                  uVar22 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                  GetEdge((SIBMesh *)local_e08,uVar21,uVar22);
                }
              }
            }
            else if ((int)uVar58 < 0x46414d41) {
              if (uVar58 == 0x46414353) {
                if ((int)local_1040.limit == (int)local_1040.current) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = 0;
                  do {
                    uVar22 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                    lVar63 = (long)local_d78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                    lVar54 = lVar63 >> 2;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              (&local_d78,(ulong)(uVar22 * 3) + lVar54 + 1);
                    *(uint *)((long)local_d78.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar63) = uVar22;
                    puVar37 = local_d78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar54 + 1;
                    if (local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_c90._0_4_ = (float)lVar54;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_d60,
                                 (iterator)
                                 local_d60.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c90);
                    }
                    else {
                      *local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = (uint)(float)lVar54;
                      local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    _local_c90 = (pointer)((ulong)(uint)stack0xfffffffffffff374 << 0x20);
                    if (local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_d48,
                                 (iterator)
                                 local_d48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c90);
                    }
                    else {
                      *local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = 0;
                      local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar48 = uVar21;
                    if (uVar22 != 0) {
                      uVar48 = uVar22 + uVar21;
                      do {
                        uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                        uVar47 = ((long)local_dc0.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_dc0.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                 -0x5555555555555555;
                        if (uVar47 < uVar23 || uVar47 - uVar23 == 0) {
                          prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                          _local_c90 = (pointer)local_c80;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_c90,"Vertex index is out of range.","");
                          std::runtime_error::runtime_error(prVar43,(string *)local_c90);
                          *(undefined ***)prVar43 = &PTR__runtime_error_008dc448;
                          __cxa_throw(prVar43,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        *puVar37 = uVar23;
                        puVar37[1] = uVar21;
                        puVar37[2] = uVar21;
                        puVar37 = puVar37 + 3;
                        uVar21 = uVar21 + 1;
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                    uVar21 = uVar48;
                  } while ((int)local_1040.limit != (int)local_1040.current);
                }
                _local_c90 = (pointer)0x0;
                local_c88._M_pi = local_c88._M_pi & 0xffffffff00000000;
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                          (&local_da8,(ulong)uVar21,(value_type *)local_c90);
                _local_c90 = (pointer)0x0;
                local_c88._M_pi = local_c88._M_pi & 0xffffffff00000000;
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                          (&local_d90,(ulong)uVar21,(value_type *)local_c90);
                local_dc8 = uVar21;
              }
              else if (uVar58 != 0x46414853) goto LAB_005f0a06;
            }
            else if (uVar58 == 0x46414d41) {
              uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
              uVar48 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
              uVar48 = uVar48 + 1;
              uVar22 = uVar21;
              if ((int)local_1040.limit != (int)local_1040.current) {
                do {
                  uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                  uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                  if (uVar22 < uVar21) {
                    uVar47 = (ulong)uVar22;
                    do {
                      if ((ulong)((long)local_d48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_d48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar47) {
                        prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                        _local_c90 = (pointer)local_c80;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_c90,"Invalid face index.","");
                        std::runtime_error::runtime_error(prVar43,(string *)local_c90);
                        *(undefined ***)prVar43 = &PTR__runtime_error_008dc448;
                        __cxa_throw(prVar43,&DeadlyImportError::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar47] = uVar48;
                      uVar47 = uVar47 + 1;
                    } while (uVar21 != uVar47);
                  }
                  uVar48 = uVar23 + 1;
                  uVar22 = uVar21;
                } while ((int)local_1040.limit != (int)local_1040.current);
              }
              uVar47 = (ulong)uVar21;
              if (uVar47 < (ulong)((long)local_d48.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_d48.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2)) {
                do {
                  uVar21 = uVar21 + 1;
                  local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar47] = uVar48;
                  uVar47 = (ulong)uVar21;
                } while (uVar47 < (ulong)((long)local_d48.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_d48.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2));
              }
            }
            else if (uVar58 != 0x464d4952) goto LAB_005f0a06;
          }
          else if ((int)uVar58 < 0x534e414d) {
            if ((int)uVar58 < 0x4d495250) {
              if (uVar58 == 0x46545653) {
                if ((int)local_1040.limit != (int)local_1040.current) {
                  do {
                    uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                    uVar22 = StreamReader<false,_false>::Get<unsigned_int>(&local_1040);
                    if ((ulong)((long)local_d60.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_d60.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) <=
                        (ulong)uVar21) {
                      prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_c90 = (pointer)local_c80;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c90,"Invalid face index.","");
                      std::runtime_error::runtime_error(prVar43,(string *)local_c90);
                      *(undefined ***)prVar43 = &PTR__runtime_error_008dc448;
                      __cxa_throw(prVar43,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    if (uVar22 != 0) {
                      puVar37 = local_d78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                                (ulong)(local_d60.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar21] + 1) + 2;
                      do {
                        uVar21 = *puVar37;
                        fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                        local_d90.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar21].x = fVar64;
                        fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                        local_d90.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar21].y = fVar64;
                        puVar37 = puVar37 + 3;
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                  } while ((int)local_1040.limit != (int)local_1040.current);
                }
              }
              else if (uVar58 != 0x494d5250) goto LAB_005f0a06;
            }
            else if ((uVar58 != 0x4d495250) && (uVar58 != 0x50494e46)) {
LAB_005f0a06:
              UnknownChunk((StreamReaderLE *)((ulong)SVar24 & 0xffffffff),pSVar52);
            }
          }
          else if ((int)uVar58 < 0x564d4952) {
            if (uVar58 == 0x534e414d) {
              ReadString((aiString *)local_c90,&local_1040,uVar21 >> 1);
              uVar47 = (ulong)_local_c90 & 0xffffffff;
              memcpy(local_838 + 4,local_c90 + 4,uVar47);
              local_838[uVar47 + 4] = 0;
              local_fa8 = uVar47;
            }
            else if (uVar58 != 0x5458534d) goto LAB_005f0a06;
          }
          else if (uVar58 != 0x564d4952) {
            if (uVar58 != 0x56525453) goto LAB_005f0a06;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_dc0,((ulong)SVar24 >> 0x20) / 0xc);
            if (2 < uVar21 >> 2) {
              lVar63 = 0;
              do {
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                *(float *)((long)&(local_dc0.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->x + lVar63) = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                *(float *)((long)&(local_dc0.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->y + lVar63) = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1040);
                *(float *)((long)&(local_dc0.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->z + lVar63) = fVar64;
                lVar63 = lVar63 + 0xc;
              } while ((ulong)(uint)((int)(((ulong)SVar24 >> 0x20) / 0xc) << 2) * 3 != lVar63);
            }
          }
          StreamReader<false,_false>::SetPtr
                    (&local_1040,
                     (int8_t *)
                     ((ulong)(uint)((int)local_1040.limit - (int)local_1040.buffer) +
                     CONCAT44(local_1040.buffer._4_4_,(int)local_1040.buffer)));
          StreamReader<false,_false>::SetReadLimit(&local_1040,uVar51);
        }
        local_838._0_4_ = (int)local_fa8;
        if ((long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
            (long)local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          __assert_fail("smesh.faceStart.size() == smesh.mtls.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                        ,0x238,"void ReadShape(SIB *, StreamReaderLE *)");
        }
        puVar59 = local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar63 = (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          lVar54 = 0;
          do {
            uVar47 = (ulong)local_d60.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar54];
            uVar51 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar47];
            if (uVar51 != 0) {
              puVar55 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar47 + 1;
              uVar58 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar47 + (ulong)(uVar51 * 3 - 3) + 1];
              do {
                uVar49 = *puVar55;
                pSVar27 = GetEdge((SIBMesh *)local_e08,uVar58,uVar49);
                if (pSVar27->faceA == 0xffffffff) {
LAB_005f0b6d:
                  pSVar27->faceA = (uint32_t)lVar54;
                }
                else if (pSVar27->faceB == 0xffffffff) {
                  pSVar27 = (SIBEdge *)&pSVar27->faceB;
                  goto LAB_005f0b6d;
                }
                puVar55 = puVar55 + 3;
                uVar51 = uVar51 - 1;
                uVar58 = uVar49;
              } while (uVar51 != 0);
            }
            lVar54 = lVar54 + 1;
            puVar59 = local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (lVar54 != lVar63 + (ulong)(lVar63 == 0));
        }
        puVar17 = local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __n = (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar59 >> 2;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_c90,__n,
                   (allocator_type *)local_ec8);
        if (puVar17 != puVar59) {
          local_e38 = __n + (__n == 0);
          uVar47 = 0;
          do {
            uVar56 = (ulong)local_d60.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar47];
            uVar61 = (ulong)local_d78.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar56];
            if (uVar61 == 0) {
              fVar64 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
            }
            else {
              fVar2 = local_dc0.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar56 + (uVar61 * 3 - 3 & 0xffffffff) + 1]].y;
              fVar4 = local_dc0.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar56 + (uVar61 * 3 - 3 & 0xffffffff) + 1]].z;
              fVar64 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
              uVar53 = 0;
              fVar67 = local_dc0.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [uVar56 + (uVar61 * 3 - 3 & 0xffffffff) + 1]].x;
              do {
                fVar68 = local_dc0.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [uVar56 + (uVar53 & 0xffffffff) + 1]].x;
                uVar3 = local_dc0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [uVar56 + (uVar53 & 0xffffffff) + 1]].y;
                uVar5 = local_dc0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [uVar56 + (uVar53 & 0xffffffff) + 1]].z;
                fVar64 = fVar64 + ((float)uVar5 * fVar2 - fVar4 * (float)uVar3);
                fVar65 = fVar65 + (fVar68 * fVar4 - fVar67 * (float)uVar5);
                fVar66 = fVar66 + (fVar67 * (float)uVar3 - fVar2 * fVar68);
                uVar53 = uVar53 + 3;
                fVar2 = (float)uVar3;
                fVar4 = (float)uVar5;
                fVar67 = fVar68;
              } while (uVar61 * 3 != uVar53);
            }
            *(ulong *)(_local_c90 + uVar47 * 0xc) = CONCAT44(fVar65,fVar64);
            *(float *)(_local_c90 + uVar47 * 0xc + 8) = fVar66;
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_e38);
          uVar47 = 0;
          do {
            local_cd8 = (int8_t *)
                        (ulong)local_d78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_d60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar47]];
            if (local_cd8 != (int8_t *)0x0) {
              local_ce8 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_d60.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar47] + 1;
              piVar62 = (int8_t *)0x0;
              local_e28 = uVar47;
              do {
                uVar58 = local_ce8[(uint)((int)piVar62 * 3)];
                local_e18 = (ulong)local_ce8[(int)piVar62 * 3 + 1];
                uVar28 = CONCAT71((uint7)(uint3)(local_ce8[(int)piVar62 * 3 + 1] >> 8),1);
                uVar47 = local_e28 & 0xffffffff;
                local_ee8 = piVar62;
                do {
                  local_f98 = (void *)CONCAT44(local_f98._4_4_,(int)uVar28);
                  local_ff8 = (aiMaterial **)0x0;
                  uStack_ff0 = 0;
                  local_fd8 = (aiVector3D **)0x0;
                  uStack_fd0 = 0;
                  local_fb8 = (char *)CONCAT44(local_fb8._4_4_,(int)uVar47);
                  uVar56 = uVar47;
                  local_1058 = uVar47;
                  while( true ) {
                    uVar47 = uVar56;
                    local_fd8 = (aiVector3D **)
                                CONCAT44((float)((ulong)*(undefined8 *)(_local_c90 + uVar47 * 0xc)
                                                >> 0x20) + local_fd8._4_4_,
                                         (float)*(undefined8 *)(_local_c90 + uVar47 * 0xc) +
                                         (float)local_fd8);
                    uStack_fd0 = CONCAT44(uStack_fd0._4_4_ + 0.0,(float)uStack_fd0 + 0.0);
                    local_ff8 = (aiMaterial **)
                                CONCAT44(local_ff8._4_4_,
                                         (float)local_ff8 +
                                         *(float *)(_local_c90 + uVar47 * 0xc + 8));
                    uVar56 = (ulong)local_d60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar47];
                    uVar51 = local_d78.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar56];
                    if (uVar51 == 0) break;
                    puVar55 = local_d78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar56 + 1;
                    uVar61 = 0xffffffff;
                    uVar49 = local_d78.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar56 + (ulong)(uVar51 * 3 - 3) + 1]
                    ;
                    do {
                      posB = *puVar55;
                      uVar21 = (uint)uVar47;
                      uVar56 = uVar61;
                      if ((uVar49 == uVar58) || (posB == uVar58)) {
                        pSVar27 = GetEdge((SIBMesh *)local_e08,uVar49,posB);
                        uVar22 = pSVar27->faceA;
                        uVar48 = pSVar27->faceB;
                        if ((((uVar22 == uVar21) || (uVar48 == uVar21)) &&
                            (pSVar27->creased == false)) &&
                           (((uVar22 == uVar21 || ((float)uVar22 == (float)local_1058)) ||
                            (uVar56 = (ulong)uVar22, uVar22 == 0xffffffff)))) {
                          uVar56 = (ulong)uVar48;
                          if (uVar48 == 0xffffffff) {
                            uVar56 = uVar61;
                          }
                          if ((float)uVar48 == (float)local_1058) {
                            uVar56 = uVar61;
                          }
                          if (uVar48 == uVar21) {
                            uVar56 = uVar61;
                          }
                        }
                      }
                      puVar55 = puVar55 + 3;
                      uVar51 = uVar51 - 1;
                      uVar61 = uVar56;
                      uVar49 = posB;
                    } while (uVar51 != 0);
                    if (((int)uVar56 == -1) ||
                       (local_1058 = uVar47, (float)(int)uVar56 == (float)local_fb8)) break;
                  }
                  uVar28 = 0;
                } while (((ulong)local_f98 & 1) != 0);
                fVar2 = SQRT((float)local_ff8 * (float)local_ff8 +
                             (float)local_fd8 * (float)local_fd8 + local_fd8._4_4_ * local_fd8._4_4_
                            );
                fVar66 = 1.0 / fVar2;
                fVar64 = (float)local_fd8;
                fVar65 = local_fd8._4_4_;
                if (1e-09 < fVar2) {
                  fVar64 = (float)local_fd8 * fVar66;
                  fVar65 = local_fd8._4_4_ * fVar66;
                }
                local_da8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_e18].x = fVar64;
                local_da8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_e18].y = fVar65;
                local_da8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_e18].z =
                     (float)(~-(uint)(1e-09 < fVar2) & (uint)(float)local_ff8 |
                            (uint)(fVar66 * (float)local_ff8) & -(uint)(1e-09 < fVar2));
                piVar62 = local_ee8 + 1;
                uVar47 = local_e28;
              } while (piVar62 != local_cd8);
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 != local_e38);
        }
        if ((aiVector3t<float> *)_local_c90 != (aiVector3t<float> *)0x0) {
          operator_delete(_local_c90);
        }
        local_ec8._0_8_ = CONCAT44(local_e08._4_4_,local_e08._0_4_);
        unique0x10003580 =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(local_e08._12_4_,local_e08._8_4_);
        local_eb8 = (int8_t *)CONCAT44(local_e08._20_4_,local_e08._16_4_);
        uStack_ea0 = (int8_t *)CONCAT44(local_ddc,local_de0);
        fStack_e94 = fStack_dd4;
        local_e98 = fStack_dd8;
        fStack_e8c = local_dcc;
        fStack_e90 = fStack_dd0;
        local_ea8 = uStack_de8;
        uStack_eb0 = uStack_df0;
        aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_ec8);
        local_e58 = local_ea8;
        local_e68 = local_eb8;
        local_e78._0_8_ = local_ec8._0_8_;
        local_e48 = local_e98;
        fStack_e44 = fStack_e94;
        fStack_e40 = fStack_e90;
        fStack_e3c = fStack_e8c;
        uStack_e50 = (int8_t *)((ulong)uStack_ea0 & 0xffffffff);
        uStack_e60 = (int8_t *)((ulong)uStack_eb0 & 0xffffffff);
        stack0xfffffffffffff190 = stack0xfffffffffffff140 & 0xffffffff;
        paVar29 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_e78);
        fVar64 = paVar29->b1;
        paVar29->b1 = paVar29->a2;
        paVar29->a2 = fVar64;
        fVar64 = paVar29->c1;
        paVar29->c1 = paVar29->a3;
        paVar29->a3 = fVar64;
        fVar64 = paVar29->c2;
        paVar29->c2 = paVar29->b3;
        paVar29->b3 = fVar64;
        fVar64 = paVar29->d1;
        paVar29->d1 = paVar29->a4;
        paVar29->a4 = fVar64;
        fVar64 = paVar29->d2;
        paVar29->d2 = paVar29->b4;
        paVar29->b4 = fVar64;
        fVar64 = paVar29->d3;
        paVar29->d3 = paVar29->c4;
        paVar29->c4 = fVar64;
        std::vector<TempMesh,_std::allocator<TempMesh>_>::vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_f08,
                   (long)iStack_f80._M_current - (long)local_f88 >> 3,(allocator_type *)local_c90);
        if (local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar47 = 0;
          do {
            uVar61 = (ulong)local_d48.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar47];
            puVar37 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar47];
            uVar56 = ((long)(local_f08._8_8_ - local_f08._0_8_) >> 5) * -0x5555555555555555;
            if (uVar56 < uVar61 || uVar56 - uVar61 == 0) {
              this_01 = DefaultLogger::get();
              Logger::error(this_01,"SIB: Face material index is invalid.");
              uVar61 = 0;
            }
            uVar28 = local_f08._0_8_;
            local_c88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            uVar51 = *puVar37;
            _local_c90 = (pointer)CONCAT44((int)((ulong)_local_c90 >> 0x20),uVar51);
            local_c88._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__((ulong)uVar51 << 2);
            pTVar46 = (pointer)(uVar28 + uVar61 * 0x60);
            if (uVar51 != 0) {
              puVar37 = puVar37 + 1;
              uVar56 = 0;
              do {
                *(int *)((long)&(local_c88._M_pi)->_vptr__Sp_counted_base + uVar56 * 4) =
                     (int)((ulong)((long)(pTVar46->vtx).
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar46->vtx).
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555;
                uVar6 = local_dc0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar37].x;
                uVar10 = local_dc0.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar37].y;
                fVar64 = local_dc0.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar37].z;
                uVar7 = local_da8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar37[1]].x;
                uVar11 = local_da8.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[puVar37[1]].y;
                fVar65 = local_da8.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[puVar37[1]].z;
                local_ed8.x = local_d90.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar37[2]].x;
                local_ed8.y = local_d90.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar37[2]].y;
                local_ed8.z = local_d90.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar37[2]].z;
                local_1008._0_8_ =
                     CONCAT44(uStack_eb0._4_4_ +
                              fVar64 * (float)uStack_eb0 +
                              (float)uVar6 * (float)local_eb8 + local_eb8._4_4_ * (float)uVar10,
                              fStack_ebc +
                              fVar64 * (float)local_ec8._8_4_ +
                              (float)uVar6 * (float)local_ec8._0_4_ +
                              (float)local_ec8._4_4_ * (float)uVar10);
                local_1008.z = fVar64 * (float)uStack_ea0 +
                               (float)uVar6 * (float)local_ea8 + (float)uVar10 * local_ea8._4_4_ +
                               uStack_ea0._4_4_;
                local_fe8.x = fStack_e6c +
                              fVar65 * (float)local_e78._8_4_ +
                              (float)uVar7 * (float)local_e78._0_4_ +
                              (float)local_e78._4_4_ * (float)uVar11;
                local_fe8.y = uStack_e60._4_4_ +
                              fVar65 * (float)uStack_e60 +
                              (float)uVar7 * (float)local_e68 + local_e68._4_4_ * (float)uVar11;
                local_fe8.z = fVar65 * (float)uStack_e50 +
                              (float)uVar7 * (float)local_e58 + (float)uVar11 * local_e58._4_4_ +
                              uStack_e50._4_4_;
                iVar8._M_current =
                     (pTVar46->vtx).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pTVar46->vtx).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pTVar46,
                             iVar8,&local_1008);
                }
                else {
                  (iVar8._M_current)->z = local_1008.z;
                  *(undefined8 *)iVar8._M_current = local_1008._0_8_;
                  ppaVar1 = &(pTVar46->vtx).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                iVar8._M_current =
                     (pTVar46->nrm).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pTVar46->nrm).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             &pTVar46->nrm,iVar8,&local_fe8);
                }
                else {
                  (iVar8._M_current)->z = local_fe8.z;
                  (iVar8._M_current)->x = local_fe8.x;
                  (iVar8._M_current)->y = local_fe8.y;
                  ppaVar1 = &(pTVar46->nrm).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                iVar8._M_current =
                     (pTVar46->uv).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pTVar46->uv).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             &pTVar46->uv,iVar8,&local_ed8);
                }
                else {
                  (iVar8._M_current)->z = local_ed8.z;
                  (iVar8._M_current)->x = local_ed8.x;
                  (iVar8._M_current)->y = local_ed8.y;
                  ppaVar1 = &(pTVar46->uv).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                uVar56 = uVar56 + 1;
                puVar37 = puVar37 + 3;
              } while (uVar56 < ((ulong)_local_c90 & 0xffffffff));
            }
            std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                      (&pTVar46->faces,(value_type *)local_c90);
            if (local_c88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              operator_delete__(local_c88._M_pi);
            }
            uVar47 = (ulong)((int)uVar47 + 1);
          } while (uVar47 < (ulong)((long)local_d60.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d60.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2));
          local_fa8 = local_838._0_8_ & 0xffffffff;
        }
        local_c90[4] = 0;
        memset(local_c90 + 5,0x1b,0x3ff);
        local_c90._0_4_ = (int)local_fa8;
        pcVar60 = (char *)(local_fa8 & 0xffffffff);
        memcpy(local_c90 + 4,local_838 + 4,(size_t)pcVar60);
        pcVar60[(long)(local_c90 + 4)] = '\0';
        local_e80->d1 = fStack_dd8;
        local_e80->d2 = fStack_dd4;
        local_e80->d3 = fStack_dd0;
        local_e80->d4 = local_dcc;
        local_e80->c1 = (float)uStack_de8;
        local_e80->c2 = uStack_de8._4_4_;
        local_e80->c3 = local_de0;
        local_e80->c4 = local_ddc;
        local_e80->b1 = (float)local_e08._16_4_;
        local_e80->b2 = (float)local_e08._20_4_;
        local_e80->b3 = (float)uStack_df0;
        local_e80->b4 = uStack_df0._4_4_;
        local_e80->a1 = (float)local_e08._0_4_;
        local_e80->a2 = (float)local_e08._4_4_;
        local_e80->a3 = (float)local_e08._8_4_;
        local_e80->a4 = (float)local_e08._12_4_;
        uVar47 = (long)local_f68._M_current - (long)pvStack_f70 >> 3;
        local_fb8 = pcVar60;
        local_f98 = (void *)uVar47;
        local_848 = uVar47;
        if (local_f08._8_8_ != local_f08._0_8_) {
          uVar47 = 0;
          p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f08._8_8_;
          pTVar46 = (pointer)local_f08._0_8_;
          do {
            if (pTVar46[uVar47].faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start !=
                pTVar46[uVar47].faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_ff8 = (aiMaterial **)uVar47;
              paVar25 = (aiMesh *)operator_new(0x520);
              pTVar46 = pTVar46 + uVar47;
              paVar25->mPrimitiveTypes = 0;
              paVar25->mNumVertices = 0;
              paVar25->mNumFaces = 0;
              __s = &paVar25->mVertices;
              memset(__s,0,0xcc);
              paVar25->mBones = (aiBone **)0x0;
              paVar25->mMaterialIndex = 0;
              (paVar25->mName).length = 0;
              (paVar25->mName).data[0] = '\0';
              memset((paVar25->mName).data + 1,0x1b,0x3ff);
              paVar25->mNumAnimMeshes = 0;
              paVar25->mAnimMeshes = (aiAnimMesh **)0x0;
              paVar25->mMethod = 0;
              (paVar25->mAABB).mMin.x = 0.0;
              (paVar25->mAABB).mMin.y = 0.0;
              (paVar25->mAABB).mMin.z = 0.0;
              (paVar25->mAABB).mMax.x = 0.0;
              (paVar25->mAABB).mMax.y = 0.0;
              (paVar25->mAABB).mMax.z = 0.0;
              memset(paVar25->mColors,0,0xa0);
              pcVar60 = local_fb8;
              (paVar25->mName).length = (ai_uint32)local_fa8;
              local_1008._0_8_ = paVar25;
              memcpy((paVar25->mName).data,local_838 + 4,(size_t)local_fb8);
              (paVar25->mName).data[(long)pcVar60] = '\0';
              uVar47 = (long)(pTVar46->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar46->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4;
              uVar51 = (uint)uVar47;
              paVar25->mNumFaces = uVar51;
              uVar47 = uVar47 & 0xffffffff;
              puVar30 = (ulong *)operator_new__(uVar47 * 0x10 + 8);
              *puVar30 = uVar47;
              paVar31 = (aiFace *)(puVar30 + 1);
              if (uVar47 != 0) {
                paVar45 = paVar31;
                do {
                  paVar45->mNumIndices = 0;
                  paVar45->mIndices = (uint *)0x0;
                  paVar45 = paVar45 + 1;
                } while (paVar45 != paVar31 + uVar47);
              }
              paVar25->mFaces = paVar31;
              uVar47 = ((long)(pTVar46->vtx).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar46->vtx).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              uVar21 = (uint)uVar47;
              paVar25->mNumVertices = uVar21;
              uVar47 = (uVar47 & 0xffffffff) * 0xc;
              paVar32 = (aiVector3D *)operator_new__(uVar47);
              local_fd8 = __s;
              if (uVar21 != 0) {
                memset(paVar32,0,((uVar47 - 0xc) / 0xc) * 0xc + 0xc);
              }
              *local_fd8 = paVar32;
              paVar32 = (aiVector3D *)operator_new__(uVar47);
              if (uVar21 != 0) {
                memset(paVar32,0,((uVar47 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar25->mNormals = paVar32;
              paVar32 = (aiVector3D *)operator_new__(uVar47);
              if (uVar21 == 0) {
                paVar25->mTextureCoords[0] = paVar32;
                paVar25->mNumUVComponents[0] = 2;
                paVar25->mMaterialIndex = (uint)local_ff8;
              }
              else {
                memset(paVar32,0,((uVar47 - 0xc) / 0xc) * 0xc + 0xc);
                paVar25->mTextureCoords[0] = paVar32;
                paVar25->mNumUVComponents[0] = 2;
                paVar25->mMaterialIndex = (uint)local_ff8;
                lVar63 = 0;
                uVar47 = 0;
                do {
                  paVar9 = (pTVar46->vtx).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar32 = paVar25->mVertices;
                  *(undefined4 *)((long)&paVar32->z + lVar63) =
                       *(undefined4 *)((long)&paVar9->z + lVar63);
                  *(undefined8 *)((long)&paVar32->x + lVar63) =
                       *(undefined8 *)((long)&paVar9->x + lVar63);
                  paVar9 = (pTVar46->nrm).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar32 = paVar25->mNormals;
                  *(undefined4 *)((long)&paVar32->z + lVar63) =
                       *(undefined4 *)((long)&paVar9->z + lVar63);
                  *(undefined8 *)((long)&paVar32->x + lVar63) =
                       *(undefined8 *)((long)&paVar9->x + lVar63);
                  paVar9 = (pTVar46->uv).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar32 = paVar25->mTextureCoords[0];
                  *(undefined4 *)((long)&paVar32->z + lVar63) =
                       *(undefined4 *)((long)&paVar9->z + lVar63);
                  *(undefined8 *)((long)&paVar32->x + lVar63) =
                       *(undefined8 *)((long)&paVar9->x + lVar63);
                  uVar47 = uVar47 + 1;
                  lVar63 = lVar63 + 0xc;
                } while (uVar47 < paVar25->mNumVertices);
                uVar51 = paVar25->mNumFaces;
              }
              if (uVar51 != 0) {
                lVar63 = 0;
                uVar47 = 0;
                do {
                  aiFace::operator=((aiFace *)((long)&paVar25->mFaces->mNumIndices + lVar63),
                                    (aiFace *)
                                    ((long)&((pTVar46->faces).
                                             super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->mNumIndices
                                    + lVar63));
                  uVar47 = uVar47 + 1;
                  lVar63 = lVar63 + 0x10;
                  paVar25 = (aiMesh *)local_1008._0_8_;
                } while (uVar47 < *(uint *)(local_1008._0_8_ + 8));
              }
              if (local_f68._M_current == ppaStack_f60) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&pvStack_f70,local_f68,
                           (aiMesh **)&local_1008);
                p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f08._8_8_;
                pTVar46 = (pointer)local_f08._0_8_;
                uVar47 = (ulong)local_ff8;
              }
              else {
                *local_f68._M_current = paVar25;
                local_f68._M_current = local_f68._M_current + 1;
                p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f08._8_8_;
                pTVar46 = (pointer)local_f08._0_8_;
                uVar47 = (ulong)local_ff8;
              }
            }
            uVar47 = uVar47 + 1;
          } while (uVar47 < (ulong)(((long)p_Var33 - (long)pTVar46 >> 5) * -0x5555555555555555));
          uVar47 = (long)local_f68._M_current - (long)pvStack_f70 >> 3;
        }
        local_840 = uVar47 - (long)local_f98;
        std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                  (&vStack_f40,(value_type *)local_c90);
        std::vector<TempMesh,_std::allocator<TempMesh>_>::~vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_f08);
        SIBMesh::~SIBMesh((SIBMesh *)local_e08);
      }
      else if (uVar58 != 0x54455850) goto LAB_005effd4;
      StreamReader<false,_false>::SetPtr
                (&local_1040,
                 (int8_t *)
                 ((ulong)(uint)((int)local_1040.limit - (int)local_1040.buffer) +
                 CONCAT44(local_1040.buffer._4_4_,(int)local_1040.buffer)));
      StreamReader<false,_false>::SetReadLimit(&local_1040,local_f08._28_4_);
    } while (((int)local_1040.limit - (int)local_1040.current & 0xfffffff8U) != 0);
  }
  lVar63 = (long)vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_start;
  std::vector<SIBObject,std::allocator<SIBObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<SIBObject*,std::vector<SIBObject,std::allocator<SIBObject>>>>
            ((vector<SIBObject,std::allocator<SIBObject>> *)&vStack_f40,
             vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_f98 = local_f88;
  uVar47 = (long)iStack_f80._M_current - (long)local_f88;
  uVar51 = (uint)(uVar47 >> 3);
  local_fc0->mNumMaterials = uVar51;
  local_fb8 = (char *)pvStack_f70;
  uVar56 = (long)local_f68._M_current - (long)pvStack_f70;
  uVar21 = (uint)(uVar56 >> 3);
  local_fc0->mNumMeshes = uVar21;
  local_fd8 = (aiVector3D **)local_f58;
  uVar61 = (long)iStack_f50._M_current - (long)local_f58;
  piVar62 = (int8_t *)(uVar61 >> 3);
  local_fc0->mNumLights = (uint)piVar62;
  if (uVar51 == 0) {
    local_ff8 = (aiMaterial **)0x0;
  }
  else {
    local_ff8 = (aiMaterial **)operator_new__(uVar47 & 0x7fffffff8);
  }
  local_fc0->mMaterials = local_ff8;
  if (uVar21 == 0) {
    __dest = (aiMesh **)0x0;
  }
  else {
    __dest = (aiMesh **)operator_new__(uVar56 & 0x7fffffff8);
  }
  local_fc0->mMeshes = __dest;
  if ((uint)piVar62 == 0) {
    ppaVar34 = (aiLight **)0x0;
  }
  else {
    local_ee8 = piVar62;
    ppaVar34 = (aiLight **)operator_new__(uVar61 & 0x7fffffff8);
    piVar62 = local_ee8;
  }
  local_fc0->mLights = ppaVar34;
  if (uVar51 != 0) {
    memcpy(local_ff8,local_f98,uVar47 & 0x7fffffff8);
  }
  if (uVar21 != 0) {
    memcpy(__dest,local_fb8,uVar56 & 0x7fffffff8);
  }
  if ((int)piVar62 != 0) {
    memcpy(ppaVar34,local_fd8,uVar61 & 0x7fffffff8);
  }
  this_02 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_02);
  pSVar16 = vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pSVar50 = vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar57._M_current = iStack_f50._M_current;
  ppaVar34 = local_f58;
  (this_02->mName).length = 9;
  builtin_strncpy((this_02->mName).data,"<SIBRoot>",10);
  lVar54 = ((long)iStack_f50._M_current - (long)local_f58 >> 3) +
           ((long)vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
  uVar51 = (uint)lVar54;
  this_02->mNumChildren = uVar51;
  if (uVar51 == 0) {
    ppaVar35 = (aiNode **)0x0;
  }
  else {
    ppaVar35 = (aiNode **)operator_new__(lVar54 * 8 & 0x7fffffff8);
  }
  this_02->mChildren = ppaVar35;
  local_fc0->mRootNode = this_02;
  if (pSVar16 == pSVar50) {
    uVar47 = 0;
  }
  else {
    uVar47 = 0;
    do {
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                      ,0x38e,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar36 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar36);
      paVar42 = (aiNode *)(pSVar50 + uVar47);
      this_02->mChildren[uVar47] = paVar36;
      if (paVar36 != paVar42) {
        uVar51 = (paVar42->mName).length;
        (paVar36->mName).length = uVar51;
        memcpy((paVar36->mName).data,(paVar42->mName).data,(ulong)uVar51);
        (paVar36->mName).data[uVar51] = '\0';
      }
      paVar36->mParent = this_02;
      fVar64 = (paVar42->mTransformation).a2;
      fVar65 = (paVar42->mTransformation).a3;
      fVar66 = (paVar42->mTransformation).a4;
      fVar2 = (paVar42->mTransformation).b1;
      fVar4 = (paVar42->mTransformation).b2;
      fVar67 = (paVar42->mTransformation).b3;
      fVar68 = (paVar42->mTransformation).b4;
      fVar69 = (paVar42->mTransformation).c1;
      fVar70 = (paVar42->mTransformation).c2;
      fVar71 = (paVar42->mTransformation).c3;
      fVar72 = (paVar42->mTransformation).c4;
      fVar12 = (paVar42->mTransformation).d1;
      fVar13 = (paVar42->mTransformation).d2;
      fVar14 = (paVar42->mTransformation).d3;
      fVar15 = (paVar42->mTransformation).d4;
      (paVar36->mTransformation).a1 = (paVar42->mTransformation).a1;
      (paVar36->mTransformation).a2 = fVar64;
      (paVar36->mTransformation).a3 = fVar65;
      (paVar36->mTransformation).a4 = fVar66;
      (paVar36->mTransformation).b1 = fVar2;
      (paVar36->mTransformation).b2 = fVar4;
      (paVar36->mTransformation).b3 = fVar67;
      (paVar36->mTransformation).b4 = fVar68;
      (paVar36->mTransformation).c1 = fVar69;
      (paVar36->mTransformation).c2 = fVar70;
      (paVar36->mTransformation).c3 = fVar71;
      (paVar36->mTransformation).c4 = fVar72;
      (paVar36->mTransformation).d1 = fVar12;
      (paVar36->mTransformation).d2 = fVar13;
      (paVar36->mTransformation).d3 = fVar14;
      (paVar36->mTransformation).d4 = fVar15;
      uVar56 = *(ulong *)&paVar42->mNumChildren;
      uVar51 = (uint)uVar56;
      paVar36->mNumMeshes = uVar51;
      if (uVar51 == 0) {
        paVar36->mMeshes = (uint *)0x0;
      }
      else {
        puVar37 = (uint *)operator_new__((uVar56 & 0xffffffff) << 2);
        paVar36->mMeshes = puVar37;
        uVar56 = 0;
        do {
          paVar36->mMeshes[uVar56] = *(int *)&paVar42->mParent + (int)uVar56;
          uVar56 = uVar56 + 1;
        } while (uVar56 < paVar36->mNumMeshes);
      }
      if ((ulong)((lVar63 >> 3) * 0x3aef6ca970586723) <= uVar47) {
        paVar38 = (aiMetadata *)operator_new(0x18);
        paVar38->mNumProperties = 1;
        paVar39 = (aiString *)operator_new__(0x404);
        paVar39->length = 0;
        paVar39->data[0] = '\0';
        memset(paVar39->data + 1,0x1b,0x3ff);
        paVar38->mKeys = paVar39;
        paVar40 = (aiMetadataEntry *)operator_new__(0x10);
        *(undefined8 *)paVar40 = 0;
        paVar40->mData = (void *)0x0;
        paVar38->mValues = paVar40;
        paVar36->mMetaData = paVar38;
        _local_c90 = (pointer)local_c80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"IsInstance","");
        _Var19._M_pi = local_c88._M_pi;
        if ((paVar38->mNumProperties != 0) &&
           (local_c88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          if (local_c88._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000400) {
            paVar39 = paVar38->mKeys;
            paVar39->length = (ai_uint32)local_c88._M_pi;
            memcpy(paVar39->data,_local_c90,(size_t)local_c88._M_pi);
            paVar39->data[(long)_Var19._M_pi] = '\0';
          }
          paVar38->mValues->mType = AI_BOOL;
          puVar41 = (undefined1 *)operator_new(1);
          *puVar41 = 1;
          paVar38->mValues->mData = puVar41;
        }
        if ((aiVector3t<float> *)_local_c90 != local_c80) {
          operator_delete(_local_c90);
        }
      }
      uVar47 = uVar47 + 1;
      pSVar50 = vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppaVar34 = local_f58;
      iVar57._M_current = iStack_f50._M_current;
    } while (uVar47 < (ulong)(((long)vStack_f40.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)vStack_f40.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x3aef6ca970586723));
  }
  if (iVar57._M_current != ppaVar34) {
    uVar56 = 0;
    do {
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                      ,0x3a7,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar36 = (aiNode *)ppaVar34[uVar56];
      if (paVar36 != (aiNode *)0x0) {
        paVar42 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar42);
        this_02->mChildren[uVar47] = paVar42;
        if (paVar42 != paVar36) {
          uVar51 = (paVar36->mName).length;
          (paVar42->mName).length = uVar51;
          memcpy((paVar42->mName).data,(paVar36->mName).data,(ulong)uVar51);
          (paVar42->mName).data[uVar51] = '\0';
        }
        uVar47 = uVar47 + 1;
        paVar42->mParent = this_02;
        ppaVar34 = local_f58;
        iVar57._M_current = iStack_f50._M_current;
      }
      uVar56 = uVar56 + 1;
    } while (uVar56 < (ulong)((long)iVar57._M_current - (long)ppaVar34 >> 3));
  }
  if (local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f28.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_f40.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f58 != (aiLight **)0x0) {
    operator_delete(local_f58);
  }
  if (pvStack_f70 != (void *)0x0) {
    operator_delete(pvStack_f70);
  }
  if (local_f88 != (void *)0x0) {
    operator_delete(local_f88);
  }
  StreamReader<false,_false>::~StreamReader(&local_1040);
  return;
}

Assistant:

void SIBImporter::InternReadFile(const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile, "rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16)
        throw DeadlyImportError("SIB file is either empty or corrupt: " + pFile);

    SIB sib;

    // Default material.
    aiMaterial* defmtl = new aiMaterial;
    aiString defname = aiString(AI_DEFAULT_MATERIAL_NAME);
    defmtl->AddProperty(&defname, AI_MATKEY_NAME);
    sib.mtls.push_back(defmtl);

    // Read it all.
    ReadScene(&sib, &stream);

    // Join the instances and objects together.
    size_t firstInst = sib.objs.size();
    sib.objs.insert(sib.objs.end(), sib.insts.begin(), sib.insts.end());
    sib.insts.clear();

    // Transfer to the aiScene.
    pScene->mNumMaterials = static_cast<unsigned int>(sib.mtls.size());
    pScene->mNumMeshes = static_cast<unsigned int>(sib.meshes.size());
    pScene->mNumLights = static_cast<unsigned int>(sib.lights.size());
    pScene->mMaterials = pScene->mNumMaterials ? new aiMaterial*[pScene->mNumMaterials] : NULL;
    pScene->mMeshes = pScene->mNumMeshes ? new aiMesh*[pScene->mNumMeshes] : NULL;
    pScene->mLights = pScene->mNumLights ? new aiLight*[pScene->mNumLights] : NULL;
    if (pScene->mNumMaterials)
        memcpy(pScene->mMaterials, &sib.mtls[0], sizeof(aiMaterial*) * pScene->mNumMaterials);
    if (pScene->mNumMeshes)
        memcpy(pScene->mMeshes, &sib.meshes[0], sizeof(aiMesh*) * pScene->mNumMeshes);
    if (pScene->mNumLights)
        memcpy(pScene->mLights, &sib.lights[0], sizeof(aiLight*) * pScene->mNumLights);

    // Construct the root node.
    size_t childIdx = 0;
    aiNode *root = new aiNode();
    root->mName.Set("<SIBRoot>");
    root->mNumChildren = static_cast<unsigned int>(sib.objs.size() + sib.lights.size());
    root->mChildren = root->mNumChildren ? new aiNode*[root->mNumChildren] : NULL;
    pScene->mRootNode = root;

    // Add nodes for each object.
    for (size_t n=0;n<sib.objs.size();n++)
    {
        ai_assert(root->mChildren);
        SIBObject& obj = sib.objs[n];
        aiNode* node = new aiNode;
        root->mChildren[childIdx++] = node;
        node->mName = obj.name;
        node->mParent = root;
        node->mTransformation = obj.axis;

        node->mNumMeshes = static_cast<unsigned int>(obj.meshCount);
        node->mMeshes = node->mNumMeshes ? new unsigned[node->mNumMeshes] : NULL;
        for (unsigned i=0;i<node->mNumMeshes;i++)
            node->mMeshes[i] = static_cast<unsigned int>(obj.meshIdx + i);

        // Mark instanced objects as being so.
        if (n >= firstInst)
        {
            node->mMetaData = aiMetadata::Alloc( 1 );
            node->mMetaData->Set( 0, "IsInstance", true );
        }
    }

    // Add nodes for each light.
    // (no transformation as the light is already in world space)
    for (size_t n=0;n<sib.lights.size();n++)
    {
        ai_assert(root->mChildren);
        aiLight* light = sib.lights[n];
        if ( nullptr != light ) {
            aiNode* node = new aiNode;
            root->mChildren[ childIdx++ ] = node;
            node->mName = light->mName;
            node->mParent = root;
        }
    }
}